

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O2

sexp_conflict
sexp_blocker(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict portorfd,
            sexp_conflict timeout)

{
  char *pcVar1;
  sexp psVar2;
  ushort uVar3;
  sexp_tag_t sVar4;
  sexp_conflict psVar5;
  sexp_conflict *ppsVar6;
  sexp_conflict psVar7;
  ulong uVar8;
  size_t __size;
  
  if (((ulong)portorfd & 3) == 0) {
    if (portorfd->tag - 0x10 < 2) {
      psVar2 = (portorfd->value).type.getters;
      if (psVar2 == (sexp)0x0) {
        psVar2 = (portorfd->value).type.slots;
        if ((((ulong)psVar2 & 3) != 0) || (psVar2->tag != 0x12)) goto LAB_00102d09;
        sVar4 = (psVar2->value).promise.donep;
      }
      else {
        sVar4 = fileno((FILE *)psVar2);
      }
    }
    else {
      if (portorfd->tag != 0x12) goto LAB_00102b9a;
      sVar4 = (portorfd->value).promise.donep;
    }
  }
  else {
LAB_00102b9a:
    if (((ulong)portorfd & 1) == 0) {
      psVar5 = (sexp_conflict)sexp_type_exception(ctx,self,0x10,portorfd);
      return psVar5;
    }
    sVar4 = (sexp_tag_t)((ulong)portorfd >> 1);
  }
  if ((int)sVar4 < 0) goto LAB_00102d09;
  uVar3 = 1;
  if (((ulong)portorfd & 3) == 0) {
    uVar3 = (ushort)(portorfd->tag == 0x11) * 3 + 1;
  }
  psVar2 = (ctx->value).type.setters;
  ppsVar6 = (psVar2->value).context.mark_stack[0xb].end;
  if (ppsVar6 == (sexp_conflict *)0x0 || ((ulong)ppsVar6 & 3) != 0) {
    uVar8 = (long)(psVar2->value).context.mark_stack[0xc].prev >> 1;
LAB_00102c4f:
    ppsVar6 = (sexp_conflict *)sexp_alloc_tagged_aux(ctx,0x20,uVar8);
    psVar5 = (sexp_conflict)malloc(0x80);
    ppsVar6[1] = psVar5;
    ppsVar6[2] = (sexp_conflict)0x0;
    ppsVar6[3] = (sexp_conflict)0x10;
    (((ctx->value).type.setters)->value).context.mark_stack[0xb].end = ppsVar6;
    psVar5 = (sexp_conflict)0x0;
  }
  else {
    uVar8 = (long)(psVar2->value).context.mark_stack[0xc].prev >> 1;
    if (uVar8 != *(uint *)ppsVar6) goto LAB_00102c4f;
    psVar5 = ppsVar6[2];
  }
  for (psVar7 = (sexp_conflict)0x0; psVar5 != psVar7;
      psVar7 = (sexp_conflict)((long)&psVar7->tag + 1)) {
    if ((&ppsVar6[1]->tag)[(long)psVar7 * 2] == sVar4) {
      pcVar1 = &ppsVar6[1]->markedp + (long)psVar7 * 8;
      *(ushort *)pcVar1 = *(ushort *)pcVar1 | uVar3;
      goto LAB_00102d09;
    }
  }
  psVar7 = ppsVar6[1];
  if (psVar5 == ppsVar6[3]) {
    psVar5 = (sexp_conflict)(ulong)(uint)((int)psVar5 * 2);
    ppsVar6[3] = psVar5;
    __size = (long)psVar5 << 3;
    psVar5 = (sexp_conflict)malloc(__size);
    ppsVar6[1] = psVar5;
    if (psVar5 != (sexp_conflict)0x0) {
      memcpy(psVar5,psVar7,__size);
    }
    free(psVar7);
    psVar7 = ppsVar6[1];
    psVar5 = ppsVar6[2];
  }
  ppsVar6[2] = (sexp_conflict)((long)&psVar5->tag + 1);
  (&psVar7->tag)[(long)psVar5 * 2] = sVar4;
  *(ushort *)(&psVar7->markedp + (long)psVar5 * 8) = uVar3;
LAB_00102d09:
  (ctx->value).flonum_bits[0x60a3] = '\x01';
  (ctx->value).opcode.dl = portorfd;
  sexp_insert_timed(ctx,ctx,timeout);
  return (sexp_conflict)0x43e;
}

Assistant:

sexp sexp_blocker (sexp ctx, sexp self, sexp_sint_t n, sexp portorfd, sexp timeout) {
  int fd;
  /* register the fd */
  if (sexp_portp(portorfd))
    fd = sexp_port_fileno(portorfd);
  else if (sexp_filenop(portorfd))
    fd = sexp_fileno_fd(portorfd);
  else if (sexp_fixnump(portorfd))
    fd = sexp_unbox_fixnum(portorfd);
  else
    return sexp_type_exception(ctx, self, SEXP_IPORT, portorfd);
  if (fd >= 0)
    sexp_insert_pollfd(ctx, fd, sexp_oportp(portorfd) ? POLLOUT : POLLIN);
  /* pause the current thread */
  sexp_context_waitp(ctx) = 1;
  sexp_context_event(ctx) = portorfd;
  sexp_insert_timed(ctx, ctx, timeout);
  return SEXP_VOID;
}